

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O1

void __thiscall
NPC::NPC(NPC *this,Map *map,short id,uchar x,uchar y,uchar spawn_type,short spawn_time,uchar index,
        bool temporary)

{
  uchar uVar1;
  undefined6 in_register_00000012;
  
  (this->damagelist).
  super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->damagelist;
  (this->damagelist).
  super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->damagelist;
  (this->damagelist).
  super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->id = (int)CONCAT62(in_register_00000012,id);
  this->map = map;
  this->temporary = temporary;
  this->index = index;
  this->x = x;
  this->spawn_x = x;
  this->y = y;
  this->spawn_y = y;
  this->alive = false;
  this->attack = false;
  uVar1 = '\a';
  if (spawn_type < 7) {
    uVar1 = spawn_type;
  }
  this->totaldamage = 0;
  this->spawn_type = uVar1;
  this->spawn_time = spawn_time;
  this->walk_idle_for = 0;
  if (spawn_type < 7) {
    this->direction = DIRECTION_DOWN;
  }
  else {
    this->direction = (Direction)spawn_time & DIRECTION_RIGHT;
    this->spawn_time = 0;
  }
  this->parent = (NPC *)0x0;
  return;
}

Assistant:

NPC::NPC(Map *map, short id, unsigned char x, unsigned char y, unsigned char spawn_type, short spawn_time, unsigned char index, bool temporary)
{
	this->id = id;
	this->map = map;
	this->temporary = temporary;
	this->index = index;
	this->spawn_x = this->x = x;
	this->spawn_y = this->y = y;
	this->alive = false;
	this->attack = false;
	this->totaldamage = 0;

	if (spawn_type > 7)
	{
		spawn_type = 7;
	}

	this->spawn_type = spawn_type;
	this->spawn_time = spawn_time;
	this->walk_idle_for = 0;

	if (spawn_type == 7)
	{
		this->direction = static_cast<Direction>(spawn_time & 0x03);
		this->spawn_time = 0;
	}
	else
	{
		this->direction = DIRECTION_DOWN;
	}

	this->parent = 0;
}